

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_evaluateScript
          (sysbvm_context_t *context,sysbvm_tuple_t script,sysbvm_tuple_t name,
          sysbvm_tuple_t language)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t environment;
  undefined1 local_80 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_868667fd gcFrame;
  sysbvm_tuple_t language_local;
  sysbvm_tuple_t name_local;
  sysbvm_tuple_t script_local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)script;
  memset(local_80,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_80);
  sVar1 = sysbvm_sourceCode_create(context,(sysbvm_tuple_t)gcFrameRecord.roots,0,name,language);
  environment = sysbvm_environment_createDefaultForSourceCodeEvaluation(context,sVar1);
  sVar1 = sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment
                    (context,environment,sVar1);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_80);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_evaluateScript(sysbvm_context_t *context, sysbvm_tuple_t script, sysbvm_tuple_t name, sysbvm_tuple_t language)
{
    struct {
        sysbvm_tuple_t script;
        sysbvm_tuple_t name;
        sysbvm_tuple_t language;
        sysbvm_tuple_t sourceLanguage;
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t sourceEnvironment;
        sysbvm_tuple_t result;
    } gcFrame = {
        .script = script,
        .name = name,
        .language = language
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.sourceCode = sysbvm_sourceCode_create(context, gcFrame.script, SYSBVM_NULL_TUPLE, gcFrame.name, gcFrame.language);
    gcFrame.sourceEnvironment = sysbvm_environment_createDefaultForSourceCodeEvaluation(context, gcFrame.sourceCode);
    gcFrame.result = sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment(context, gcFrame.sourceEnvironment, gcFrame.sourceCode);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}